

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O1

void initShellData(void)

{
  QMultiHash<char,_QLatin1String> QVar1;
  QMultiHash<char,_QLatin1String> QVar2;
  QMultiHash<char,_QLatin1String> QVar3;
  Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *pDVar4;
  long lVar5;
  QMultiHash<char,_QLatin1String> moved;
  char local_d19;
  QMultiHash<char,_QLatin1String> local_d18;
  iterator local_d08;
  undefined1 local_cf0 [16];
  char *local_ce0;
  undefined1 local_cd8;
  undefined8 local_cd0;
  char *local_cc8;
  undefined1 local_cc0;
  undefined8 local_cb8;
  char *local_cb0;
  undefined1 local_ca8;
  undefined8 local_ca0;
  char *local_c98;
  undefined1 local_c90;
  undefined8 local_c88;
  char *local_c80;
  undefined1 local_c78;
  undefined8 local_c70;
  char *local_c68;
  undefined1 local_c60;
  undefined8 local_c58;
  char *local_c50;
  undefined1 local_c48;
  undefined8 local_c40;
  char *local_c38;
  undefined1 local_c30;
  undefined8 local_c28;
  char *local_c20;
  undefined1 local_c18;
  undefined8 local_c10;
  char *local_c08;
  undefined1 local_c00;
  undefined8 local_bf8;
  char *local_bf0;
  undefined1 local_be8;
  undefined8 local_be0;
  char *local_bd8;
  undefined1 local_bd0;
  undefined8 local_bc8;
  char *local_bc0;
  undefined1 local_bb8;
  undefined8 local_bb0;
  char *local_ba8;
  undefined1 local_ba0;
  undefined8 local_b98;
  char *local_b90;
  undefined1 local_b88;
  undefined8 local_b80;
  char *local_b78;
  undefined1 local_b70;
  undefined8 local_b68;
  char *local_b60;
  undefined1 local_b58;
  undefined8 local_b50;
  char *local_b48;
  undefined1 local_b40;
  undefined8 local_b38;
  char *local_b30;
  undefined1 local_b28;
  undefined8 local_b20;
  char *local_b18;
  undefined1 local_b10;
  undefined8 local_b08;
  char *local_b00;
  undefined1 local_af8;
  undefined8 local_af0;
  char *local_ae8;
  undefined1 local_ae0;
  undefined8 local_ad8;
  char *local_ad0;
  undefined1 local_ac8;
  undefined8 local_ac0;
  char *local_ab8;
  undefined1 local_ab0;
  undefined8 local_aa8;
  char *local_aa0;
  undefined1 local_a98;
  undefined8 local_a90;
  char *local_a88;
  undefined1 local_a80;
  undefined8 local_a78;
  char *local_a70;
  undefined1 local_a68;
  undefined8 local_a60;
  char *local_a58;
  undefined1 local_a50;
  undefined8 local_a48;
  char *local_a40;
  undefined1 local_a38;
  undefined8 local_a30;
  char *local_a28;
  undefined1 local_a20;
  undefined8 local_a18;
  char *local_a10;
  undefined1 local_a08;
  undefined8 local_a00;
  char *local_9f8;
  undefined1 local_9f0;
  undefined8 local_9e8;
  char *local_9e0;
  undefined1 local_9d8;
  undefined8 local_9d0;
  char *local_9c8;
  undefined1 local_9c0;
  undefined8 local_9b8;
  char *local_9b0;
  undefined1 local_9a8;
  undefined8 local_9a0;
  char *local_998;
  undefined1 local_990;
  undefined8 local_988;
  char *local_980;
  undefined1 local_978;
  undefined8 local_970;
  char *local_968;
  undefined1 local_960;
  undefined8 local_958;
  char *local_950;
  undefined1 local_948;
  undefined8 local_940;
  char *local_938;
  undefined1 local_930;
  undefined8 local_928;
  char *local_920;
  undefined1 local_918;
  undefined8 local_910;
  char *local_908;
  undefined1 local_900;
  undefined8 local_8f8;
  char *local_8f0;
  undefined1 local_8e8;
  undefined8 local_8e0;
  char *local_8d8;
  undefined1 local_8d0;
  undefined8 local_8c8;
  char *local_8c0;
  undefined1 local_8b8;
  undefined8 local_8b0;
  char *local_8a8;
  undefined1 local_8a0;
  undefined8 local_898;
  char *local_890;
  undefined1 local_888;
  undefined8 local_880;
  char *local_878;
  undefined1 local_870;
  undefined8 local_868;
  char *local_860;
  undefined1 local_858;
  undefined8 local_850;
  char *local_848;
  undefined1 local_840;
  undefined8 local_838;
  char *local_830;
  undefined1 local_828;
  undefined8 local_820;
  char *local_818;
  undefined1 local_810;
  undefined8 local_808;
  char *local_800;
  undefined1 local_7f8;
  undefined8 local_7f0;
  char *local_7e8;
  undefined1 local_7e0;
  undefined8 local_7d8;
  char *local_7d0;
  undefined1 local_7c8;
  undefined8 local_7c0;
  char *local_7b8;
  undefined1 local_7b0;
  undefined8 local_7a8;
  char *local_7a0;
  undefined1 local_798;
  undefined8 local_790;
  char *local_788;
  undefined1 local_780;
  undefined8 local_778;
  char *local_770;
  undefined1 local_768;
  undefined8 local_760;
  char *local_758;
  undefined1 local_750;
  undefined8 local_748;
  char *local_740;
  undefined1 local_738;
  undefined8 local_730;
  char *local_728;
  undefined1 local_720;
  undefined8 local_718;
  char *local_710;
  undefined1 local_708;
  undefined8 local_700;
  char *local_6f8;
  undefined1 local_6f0;
  undefined8 local_6e8;
  char *local_6e0;
  undefined1 local_6d8;
  undefined8 local_6d0;
  char *local_6c8;
  undefined1 local_6c0;
  undefined8 local_6b8;
  char *local_6b0;
  undefined1 local_6a8;
  undefined8 local_6a0;
  char *local_698;
  undefined1 local_690;
  undefined8 local_688;
  char *local_680;
  undefined1 local_678;
  undefined8 local_670;
  char *local_668;
  undefined1 local_660;
  undefined8 local_658;
  char *local_650;
  undefined1 local_648;
  undefined8 local_640;
  char *local_638;
  undefined1 local_630;
  undefined8 local_628;
  char *local_620;
  undefined1 local_618;
  undefined8 local_610;
  char *local_608;
  undefined1 local_600;
  undefined8 local_5f8;
  char *local_5f0;
  undefined1 local_5e8;
  undefined8 local_5e0;
  char *local_5d8;
  undefined1 local_5d0;
  undefined8 local_5c8;
  char *local_5c0;
  undefined1 local_5b8;
  undefined8 local_5b0;
  char *local_5a8;
  undefined1 local_5a0;
  undefined8 local_598;
  char *local_590;
  undefined1 local_588;
  undefined8 local_580;
  char *local_578;
  undefined1 local_570;
  undefined8 local_568;
  char *local_560;
  undefined1 local_558;
  undefined8 local_550;
  char *local_548;
  undefined1 local_540;
  undefined8 local_538;
  char *local_530;
  undefined1 local_528;
  undefined8 local_520;
  char *local_518;
  undefined1 local_510;
  undefined8 local_508;
  char *local_500;
  undefined1 local_4f8;
  undefined8 local_4f0;
  char *local_4e8;
  undefined1 local_4e0;
  undefined8 local_4d8;
  char *local_4d0;
  undefined1 local_4c8;
  undefined8 local_4c0;
  char *local_4b8;
  undefined1 local_4b0;
  undefined8 local_4a8;
  char *local_4a0;
  undefined1 local_498;
  undefined8 local_490;
  char *local_488;
  undefined1 local_480;
  undefined8 local_478;
  char *local_470;
  undefined1 local_468;
  undefined8 local_460;
  char *local_458;
  undefined1 local_450;
  undefined8 local_448;
  char *local_440;
  undefined1 local_438;
  undefined8 local_430;
  char *local_428;
  undefined1 local_420;
  undefined8 local_418;
  char *local_410;
  undefined1 local_408;
  undefined8 local_400;
  char *local_3f8;
  undefined1 local_3f0;
  undefined8 local_3e8;
  char *local_3e0;
  undefined1 local_3d8;
  undefined8 local_3d0;
  char *local_3c8;
  undefined1 local_3c0;
  undefined8 local_3b8;
  char *local_3b0;
  undefined1 local_3a8;
  undefined8 local_3a0;
  char *local_398;
  undefined1 local_390;
  undefined8 local_388;
  char *local_380;
  undefined1 local_378;
  undefined8 local_370;
  char *local_368;
  undefined1 local_360;
  undefined8 local_358;
  char *local_350;
  undefined1 local_348;
  undefined8 local_340;
  char *local_338;
  undefined1 local_330;
  undefined8 local_328;
  char *local_320;
  undefined1 local_318;
  undefined8 local_310;
  char *local_308;
  undefined1 local_300;
  undefined8 local_2f8;
  char *local_2f0;
  undefined1 local_2e8;
  undefined8 local_2e0;
  char *local_2d8;
  undefined1 local_2d0;
  undefined8 local_2c8;
  char *local_2c0;
  undefined1 local_2b8;
  undefined8 local_2b0;
  char *local_2a8;
  undefined1 local_2a0;
  undefined8 local_298;
  char *local_290;
  undefined1 local_288;
  undefined8 local_280;
  char *local_278;
  undefined1 local_270;
  undefined8 local_268;
  char *local_260;
  undefined1 local_258;
  undefined8 local_250;
  char *local_248;
  undefined1 local_240;
  undefined8 local_238;
  char *local_230;
  undefined1 local_228;
  undefined8 local_220;
  char *local_218;
  undefined1 local_210;
  undefined8 local_208;
  char *local_200;
  undefined1 local_1f8;
  undefined8 local_1f0;
  char *local_1e8;
  undefined1 local_1e0;
  undefined8 local_1d8;
  char *local_1d0;
  undefined1 local_1c8;
  undefined8 local_1c0;
  char *local_1b8;
  undefined1 local_1b0;
  undefined8 local_1a8;
  char *local_1a0;
  undefined1 local_198;
  undefined8 local_190;
  char *local_188;
  undefined1 local_180;
  undefined8 local_178;
  char *local_170;
  undefined1 local_168;
  undefined8 local_160;
  char *local_158;
  undefined1 local_150;
  undefined8 local_148;
  char *local_140;
  undefined1 local_138;
  undefined8 local_130;
  char *local_128;
  undefined1 local_120;
  undefined8 local_118;
  char *local_110;
  undefined1 local_108;
  undefined8 local_100;
  char *local_f8;
  undefined1 local_f0;
  undefined8 local_e8;
  char *local_e0;
  undefined1 local_d8;
  undefined8 local_d0;
  char *local_c8;
  undefined1 local_c0;
  undefined8 local_b8;
  char *local_b0;
  undefined1 local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined1 local_90;
  undefined8 local_88;
  char *local_80;
  undefined1 local_78;
  undefined8 local_70;
  char *local_68;
  undefined1 local_60;
  undefined8 local_58;
  char *local_50;
  undefined1 local_48;
  undefined8 local_40;
  char *local_38;
  
  local_cf0[0] = 0x69;
  local_cf0._8_8_ = 2;
  local_ce0 = "if";
  local_cd8 = 0x74;
  local_cd0 = 4;
  local_cc8 = "then";
  local_cc0 = 0x65;
  local_cb8 = 4;
  local_cb0 = "else";
  local_ca8 = 0x65;
  local_ca0 = 4;
  local_c98 = "elif";
  local_c90 = 0x66;
  local_c88 = 2;
  local_c80 = "fi";
  local_c78 = 0x66;
  local_c70 = 3;
  local_c68 = "for";
  local_c60 = 0x77;
  local_c58 = 5;
  local_c50 = "while";
  local_c48 = 0x69;
  local_c40 = 2;
  local_c38 = "in";
  local_c30 = 100;
  local_c28 = 2;
  local_c20 = "do";
  local_c18 = 100;
  local_c10 = 4;
  local_c08 = "done";
  local_c00 = 99;
  local_bf8 = 4;
  local_bf0 = "case";
  local_be8 = 0x65;
  local_be0 = 4;
  local_bd8 = "esac";
  local_bd0 = 0x66;
  local_bc8 = 8;
  local_bc0 = "function";
  pDVar4 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar4,0xd);
  local_d18.m_size = 0;
  lVar5 = 0;
  local_d18.d = pDVar4;
  do {
    local_d19 = local_cf0[lVar5];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_d08,&local_d18,&local_d19,(QLatin1String *)(local_cf0 + lVar5 + 8));
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x138);
  QVar1.m_size = local_d18.m_size;
  QVar1.d = local_d18.d;
  local_d18.d = (Data *)0x0;
  local_d18.m_size = 0;
  local_d08.i.d = shell_keywords.d;
  local_d08.i.bucket = shell_keywords.m_size;
  shell_keywords = QVar1;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_d08);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_d18);
  local_d08.i = (piter)ZEXT816(0);
  local_cf0._8_8_ = shell_types.m_size;
  local_cf0._0_8_ = shell_types.d;
  shell_types.d = (Data *)0x0;
  shell_types.m_size = 0;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)local_cf0);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_d08);
  local_cf0[0] = 0x66;
  local_cf0._8_8_ = 5;
  local_ce0 = "false";
  local_cd8 = 0x74;
  local_cd0 = 4;
  local_cc8 = "true";
  pDVar4 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar4,2);
  local_d18.m_size = 0;
  lVar5 = 0;
  local_d18.d = pDVar4;
  do {
    local_d19 = local_cf0[lVar5];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_d08,&local_d18,&local_d19,(QLatin1String *)(local_cf0 + lVar5 + 8));
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x30);
  QVar2.m_size = local_d18.m_size;
  QVar2.d = local_d18.d;
  local_d18.d = (Data *)0x0;
  local_d18.m_size = 0;
  local_d08.i.d = shell_literals.d;
  local_d08.i.bucket = shell_literals.m_size;
  shell_literals = QVar2;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_d08);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_d18);
  local_cf0[0] = 0x62;
  local_cf0._8_8_ = 5;
  local_ce0 = "break";
  local_cd8 = 99;
  local_cd0 = 2;
  local_cc8 = "cd";
  local_cc0 = 99;
  local_cb8 = 8;
  local_cb0 = "continue";
  local_ca8 = 0x65;
  local_ca0 = 4;
  local_c98 = "eval";
  local_c90 = 0x65;
  local_c88 = 4;
  local_c80 = "exec";
  local_c78 = 0x65;
  local_c70 = 4;
  local_c68 = "exit";
  local_c60 = 0x65;
  local_c58 = 6;
  local_c50 = "export";
  local_c48 = 0x67;
  local_c40 = 7;
  local_c38 = "getopts";
  local_c30 = 0x68;
  local_c28 = 4;
  local_c20 = "hash";
  local_c18 = 0x70;
  local_c10 = 3;
  local_c08 = "pwd";
  local_c00 = 0x72;
  local_bf8 = 8;
  local_bf0 = "readonly";
  local_be8 = 0x72;
  local_be0 = 6;
  local_bd8 = "return";
  local_bd0 = 0x73;
  local_bc8 = 5;
  local_bc0 = "shift";
  local_bb8 = 0x74;
  local_bb0 = 4;
  local_ba8 = "test";
  local_ba0 = 0x74;
  local_b98 = 9;
  local_b90 = "timestrap";
  local_b88 = 0x75;
  local_b80 = 5;
  local_b78 = "umask";
  local_b70 = 0x75;
  local_b68 = 5;
  local_b60 = "unset";
  local_b58 = 0x42;
  local_b50 = 4;
  local_b48 = "Bash";
  local_b40 = 0x61;
  local_b38 = 5;
  local_b30 = "alias";
  local_b28 = 0x62;
  local_b20 = 4;
  local_b18 = "bind";
  local_b10 = 0x62;
  local_b08 = 7;
  local_b00 = "builtin";
  local_af8 = 99;
  local_af0 = 6;
  local_ae8 = "caller";
  local_ae0 = 99;
  local_ad8 = 7;
  local_ad0 = "command";
  local_ac8 = 100;
  local_ac0 = 7;
  local_ab8 = "declare";
  local_ab0 = 0x65;
  local_aa8 = 4;
  local_aa0 = "echo";
  local_a98 = 0x65;
  local_a90 = 6;
  local_a88 = "enable";
  local_a80 = 0x68;
  local_a78 = 4;
  local_a70 = "help";
  local_a68 = 0x6c;
  local_a60 = 3;
  local_a58 = "let";
  local_a50 = 0x6c;
  local_a48 = 5;
  local_a40 = "local";
  local_a38 = 0x6c;
  local_a30 = 6;
  local_a28 = "logout";
  local_a20 = 0x6d;
  local_a18 = 7;
  local_a10 = "mapfile";
  local_a08 = 0x70;
  local_a00 = 10;
  local_9f8 = "printfread";
  local_9f0 = 0x72;
  local_9e8 = 9;
  local_9e0 = "readarray";
  local_9d8 = 0x73;
  local_9d0 = 6;
  local_9c8 = "source";
  local_9c0 = 0x74;
  local_9b8 = 4;
  local_9b0 = "type";
  local_9a8 = 0x74;
  local_9a0 = 7;
  local_998 = "typeset";
  local_990 = 0x75;
  local_988 = 6;
  local_980 = "ulimit";
  local_978 = 0x75;
  local_970 = 7;
  local_968 = "unalias";
  local_960 = 0x6d;
  local_958 = 9;
  local_950 = "modifiers";
  local_948 = 0x73;
  local_940 = 3;
  local_938 = "set";
  local_930 = 0x73;
  local_928 = 5;
  local_920 = "shopt";
  local_918 = 0x61;
  local_910 = 8;
  local_908 = "autoload";
  local_900 = 0x62;
  local_8f8 = 2;
  local_8f0 = "bg";
  local_8e8 = 0x62;
  local_8e0 = 7;
  local_8d8 = "bindkey";
  local_8d0 = 0x62;
  local_8c8 = 3;
  local_8c0 = "bye";
  local_8b8 = 99;
  local_8b0 = 3;
  local_8a8 = "cap";
  local_8a0 = 99;
  local_898 = 5;
  local_890 = "chdir";
  local_888 = 99;
  local_880 = 5;
  local_878 = "clone";
  local_870 = 99;
  local_868 = 0xd;
  local_860 = "comparguments";
  local_858 = 99;
  local_850 = 8;
  local_848 = "compcall";
  local_840 = 99;
  local_838 = 7;
  local_830 = "compctl";
  local_828 = 99;
  local_820 = 0xc;
  local_818 = "compdescribe";
  local_810 = 99;
  local_808 = 0x13;
  local_800 = "compfilescompgroups";
  local_7f8 = 99;
  local_7f0 = 9;
  local_7e8 = "compquote";
  local_7e0 = 99;
  local_7d8 = 8;
  local_7d0 = "comptags";
  local_7c8 = 99;
  local_7c0 = 7;
  local_7b8 = "comptry";
  local_7b0 = 99;
  local_7a8 = 10;
  local_7a0 = "compvalues";
  local_798 = 100;
  local_790 = 4;
  local_788 = "dirs";
  local_780 = 100;
  local_778 = 7;
  local_770 = "disable";
  local_768 = 100;
  local_760 = 6;
  local_758 = "disown";
  local_750 = 0x65;
  local_748 = 6;
  local_740 = "echotc";
  local_738 = 0x65;
  local_730 = 6;
  local_728 = "echoti";
  local_720 = 0x65;
  local_718 = 9;
  local_710 = "emulatefc";
  local_708 = 0x66;
  local_700 = 2;
  local_6f8 = "fg";
  local_6f0 = 0x66;
  local_6e8 = 5;
  local_6e0 = "float";
  local_6d8 = 0x66;
  local_6d0 = 9;
  local_6c8 = "functions";
  local_6c0 = 0x67;
  local_6b8 = 6;
  local_6b0 = "getcap";
  local_6a8 = 0x67;
  local_6a0 = 5;
  local_698 = "getln";
  local_690 = 0x68;
  local_688 = 7;
  local_680 = "history";
  local_678 = 0x69;
  local_670 = 7;
  local_668 = "integer";
  local_660 = 0x6a;
  local_658 = 4;
  local_650 = "jobs";
  local_648 = 0x6b;
  local_640 = 4;
  local_638 = "kill";
  local_630 = 0x6c;
  local_628 = 5;
  local_620 = "limit";
  local_618 = 0x6c;
  local_610 = 3;
  local_608 = "log";
  local_600 = 0x6e;
  local_5f8 = 6;
  local_5f0 = "noglob";
  local_5e8 = 0x70;
  local_5e0 = 4;
  local_5d8 = "popd";
  local_5d0 = 0x70;
  local_5c8 = 10;
  local_5c0 = "printpushd";
  local_5b8 = 0x70;
  local_5b0 = 6;
  local_5a8 = "pushln";
  local_5a0 = 0x72;
  local_598 = 6;
  local_590 = "rehash";
  local_588 = 0x73;
  local_580 = 5;
  local_578 = "sched";
  local_570 = 0x73;
  local_568 = 6;
  local_560 = "setcap";
  local_558 = 0x73;
  local_550 = 6;
  local_548 = "setopt";
  local_540 = 0x73;
  local_538 = 4;
  local_530 = "stat";
  local_528 = 0x73;
  local_520 = 7;
  local_518 = "suspend";
  local_510 = 0x74;
  local_508 = 6;
  local_500 = "ttyctl";
  local_4f8 = 0x75;
  local_4f0 = 10;
  local_4e8 = "unfunction";
  local_4e0 = 0x75;
  local_4d8 = 6;
  local_4d0 = "unhash";
  local_4c8 = 0x75;
  local_4c0 = 0xf;
  local_4b8 = "unlimitunsetopt";
  local_4b0 = 0x76;
  local_4a8 = 5;
  local_4a0 = "vared";
  local_498 = 0x77;
  local_490 = 4;
  local_488 = "wait";
  local_480 = 0x77;
  local_478 = 6;
  local_470 = "whence";
  local_468 = 0x77;
  local_460 = 5;
  local_458 = "where";
  local_450 = 0x77;
  local_448 = 5;
  local_440 = "which";
  local_438 = 0x7a;
  local_430 = 8;
  local_428 = "zcompile";
  local_420 = 0x7a;
  local_418 = 7;
  local_410 = "zformat";
  local_408 = 0x7a;
  local_400 = 4;
  local_3f8 = "zftp";
  local_3f0 = 0x7a;
  local_3e8 = 3;
  local_3e0 = "zle";
  local_3d8 = 0x7a;
  local_3d0 = 8;
  local_3c8 = "zmodload";
  local_3c0 = 0x7a;
  local_3b8 = 10;
  local_3b0 = "zparseopts";
  local_3a8 = 0x7a;
  local_3a0 = 5;
  local_398 = "zprof";
  local_390 = 0x7a;
  local_388 = 4;
  local_380 = "zpty";
  local_378 = 0x7a;
  local_370 = 0xb;
  local_368 = "zregexparse";
  local_360 = 0x7a;
  local_358 = 7;
  local_350 = "zsocket";
  local_348 = 0x7a;
  local_340 = 6;
  local_338 = "zstyle";
  local_330 = 0x7a;
  local_328 = 4;
  local_320 = "ztcp";
  local_318 = 0x67;
  local_310 = 3;
  local_308 = "git";
  local_300 = 0x72;
  local_2f8 = 2;
  local_2f0 = "rm";
  local_2e8 = 0x73;
  local_2e0 = 4;
  local_2d8 = "sudo";
  local_2d0 = 0x66;
  local_2c8 = 5;
  local_2c0 = "fdisk";
  local_2b8 = 0x61;
  local_2b0 = 3;
  local_2a8 = "apt";
  local_2a0 = 0x73;
  local_298 = 4;
  local_290 = "snap";
  local_288 = 0x66;
  local_280 = 7;
  local_278 = "flatpak";
  local_270 = 0x73;
  local_268 = 9;
  local_260 = "snapcraft";
  local_258 = 0x79;
  local_250 = 6;
  local_248 = "yaourt";
  local_240 = 0x6e;
  local_238 = 5;
  local_230 = "nmcli";
  local_228 = 0x70;
  local_220 = 6;
  local_218 = "pacman";
  local_210 = 0x70;
  local_208 = 5;
  local_200 = "pamac";
  local_1f8 = 0x66;
  local_1f0 = 4;
  local_1e8 = "fsck";
  local_1e0 = 0x6d;
  local_1d8 = 5;
  local_1d0 = "mount";
  local_1c8 = 0x6d;
  local_1c0 = 5;
  local_1b8 = "mkdir";
  local_1b0 = 0x6d;
  local_1a8 = 6;
  local_1a0 = "mkswap";
  local_198 = 0x73;
  local_190 = 5;
  local_188 = "sleep";
  local_180 = 0x6c;
  local_178 = 2;
  local_170 = "ls";
  local_168 = 0x77;
  local_160 = 4;
  local_158 = "wget";
  local_150 = 0x6b;
  local_148 = 4;
  local_140 = "kill";
  local_138 = 0x6b;
  local_130 = 7;
  local_128 = "killall";
  local_120 = 0x67;
  local_118 = 3;
  local_110 = "gdb";
  local_108 = 0x51;
  local_100 = 9;
  local_f8 = "QOwnNotes";
  local_f0 = 0x71;
  local_e8 = 9;
  local_e0 = "qownnotes";
  local_d8 = 100;
  local_d0 = 6;
  local_c8 = "docker";
  local_c0 = 0x6f;
  local_b8 = 7;
  local_b0 = "openssl";
  local_a8 = 0x70;
  local_a0 = 3;
  local_98 = "php";
  local_90 = 0x70;
  local_88 = 6;
  local_80 = "python";
  local_78 = 0x70;
  local_70 = 4;
  local_68 = "perl";
  local_60 = 0x67;
  local_58 = 2;
  local_50 = "go";
  local_48 = 99;
  local_40 = 4;
  local_38 = "curl";
  pDVar4 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar4,0x88);
  local_d18.m_size = 0;
  lVar5 = 0;
  local_d18.d = pDVar4;
  do {
    local_d19 = local_cf0[lVar5];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_d08,&local_d18,&local_d19,(QLatin1String *)(local_cf0 + lVar5 + 8));
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0xcc0);
  QVar3.m_size = local_d18.m_size;
  QVar3.d = local_d18.d;
  local_d18.d = (Data *)0x0;
  local_d18.m_size = 0;
  local_d08.i.d = shell_builtin.d;
  local_d08.i.bucket = shell_builtin.m_size;
  shell_builtin = QVar3;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_d08);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_d18);
  local_d08.i = (piter)ZEXT816(0);
  local_cf0._8_8_ = shell_other.m_size;
  local_cf0._0_8_ = shell_other.d;
  shell_other.d = (Data *)0x0;
  shell_other.m_size = 0;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)local_cf0);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_d08);
  return;
}

Assistant:

void initShellData() {
    shell_keywords = {
        {('i'), QLatin1String("if")},      {('t'), QLatin1String("then")},
        {('e'), QLatin1String("else")},    {('e'), QLatin1String("elif")},
        {('f'), QLatin1String("fi")},      {('f'), QLatin1String("for")},
        {('w'), QLatin1String("while")},   {('i'), QLatin1String("in")},
        {('d'), QLatin1String("do")},      {('d'), QLatin1String("done")},
        {('c'), QLatin1String("case")},    {('e'), QLatin1String("esac")},
        {('f'), QLatin1String("function")}};

    shell_types = {};

    shell_literals = {{('f'), QLatin1String("false")},
                      {('t'), QLatin1String("true")}};

    shell_builtin = {{('b'), QLatin1String("break")},
                     {('c'), QLatin1String("cd")},
                     {('c'), QLatin1String("continue")},
                     {('e'), QLatin1String("eval")},
                     {('e'), QLatin1String("exec")},
                     {('e'), QLatin1String("exit")},
                     {('e'), QLatin1String("export")},
                     {('g'), QLatin1String("getopts")},
                     {('h'), QLatin1String("hash")},
                     {('p'), QLatin1String("pwd")},
                     {('r'), QLatin1String("readonly")},
                     {('r'), QLatin1String("return")},
                     {('s'), QLatin1String("shift")},
                     {('t'), QLatin1String("test")},
                     {('t'), QLatin1String("timestrap")},
                     {('u'), QLatin1String("umask")},
                     {('u'), QLatin1String("unset")},
                     {('B'), QLatin1String("Bash")},
                     {('a'), QLatin1String("alias")},
                     {('b'), QLatin1String("bind")},
                     {('b'), QLatin1String("builtin")},
                     {('c'), QLatin1String("caller")},
                     {('c'), QLatin1String("command")},
                     {('d'), QLatin1String("declare")},
                     {('e'), QLatin1String("echo")},
                     {('e'), QLatin1String("enable")},
                     {('h'), QLatin1String("help")},
                     {('l'), QLatin1String("let")},
                     {('l'), QLatin1String("local")},
                     {('l'), QLatin1String("logout")},
                     {('m'), QLatin1String("mapfile")},
                     {('p'), QLatin1String("printfread")},
                     {('r'), QLatin1String("readarray")},
                     {('s'), QLatin1String("source")},
                     {('t'), QLatin1String("type")},
                     {('t'), QLatin1String("typeset")},
                     {('u'), QLatin1String("ulimit")},
                     {('u'), QLatin1String("unalias")},
                     {('m'), QLatin1String("modifiers")},
                     {('s'), QLatin1String("set")},
                     {('s'), QLatin1String("shopt")},
                     {('a'), QLatin1String("autoload")},
                     {('b'), QLatin1String("bg")},
                     {('b'), QLatin1String("bindkey")},
                     {('b'), QLatin1String("bye")},
                     {('c'), QLatin1String("cap")},
                     {('c'), QLatin1String("chdir")},
                     {('c'), QLatin1String("clone")},
                     {('c'), QLatin1String("comparguments")},
                     {('c'), QLatin1String("compcall")},
                     {('c'), QLatin1String("compctl")},
                     {('c'), QLatin1String("compdescribe")},
                     {('c'), QLatin1String("compfilescompgroups")},
                     {('c'), QLatin1String("compquote")},
                     {('c'), QLatin1String("comptags")},
                     {('c'), QLatin1String("comptry")},
                     {('c'), QLatin1String("compvalues")},
                     {('d'), QLatin1String("dirs")},
                     {('d'), QLatin1String("disable")},
                     {('d'), QLatin1String("disown")},
                     {('e'), QLatin1String("echotc")},
                     {('e'), QLatin1String("echoti")},
                     {('e'), QLatin1String("emulatefc")},
                     {('f'), QLatin1String("fg")},
                     {('f'), QLatin1String("float")},
                     {('f'), QLatin1String("functions")},
                     {('g'), QLatin1String("getcap")},
                     {('g'), QLatin1String("getln")},
                     {('h'), QLatin1String("history")},
                     {('i'), QLatin1String("integer")},
                     {('j'), QLatin1String("jobs")},
                     {('k'), QLatin1String("kill")},
                     {('l'), QLatin1String("limit")},
                     {('l'), QLatin1String("log")},
                     {('n'), QLatin1String("noglob")},
                     {('p'), QLatin1String("popd")},
                     {('p'), QLatin1String("printpushd")},
                     {('p'), QLatin1String("pushln")},
                     {('r'), QLatin1String("rehash")},
                     {('s'), QLatin1String("sched")},
                     {('s'), QLatin1String("setcap")},
                     {('s'), QLatin1String("setopt")},
                     {('s'), QLatin1String("stat")},
                     {('s'), QLatin1String("suspend")},
                     {('t'), QLatin1String("ttyctl")},
                     {('u'), QLatin1String("unfunction")},
                     {('u'), QLatin1String("unhash")},
                     {('u'), QLatin1String("unlimitunsetopt")},
                     {('v'), QLatin1String("vared")},
                     {('w'), QLatin1String("wait")},
                     {('w'), QLatin1String("whence")},
                     {('w'), QLatin1String("where")},
                     {('w'), QLatin1String("which")},
                     {('z'), QLatin1String("zcompile")},
                     {('z'), QLatin1String("zformat")},
                     {('z'), QLatin1String("zftp")},
                     {('z'), QLatin1String("zle")},
                     {('z'), QLatin1String("zmodload")},
                     {('z'), QLatin1String("zparseopts")},
                     {('z'), QLatin1String("zprof")},
                     {('z'), QLatin1String("zpty")},
                     {('z'), QLatin1String("zregexparse")},
                     {('z'), QLatin1String("zsocket")},
                     {('z'), QLatin1String("zstyle")},
                     {('z'), QLatin1String("ztcp")},
                     {('g'), QLatin1String("git")},
                     {('r'), QLatin1String("rm")},
                     {('s'), QLatin1String("sudo")},
                     {('f'), QLatin1String("fdisk")},
                     {('a'), QLatin1String("apt")},
                     {('s'), QLatin1String("snap")},
                     {('f'), QLatin1String("flatpak")},
                     {('s'), QLatin1String("snapcraft")},
                     {('y'), QLatin1String("yaourt")},
                     {('n'), QLatin1String("nmcli")},
                     {('p'), QLatin1String("pacman")},
                     {('p'), QLatin1String("pamac")},
                     {('f'), QLatin1String("fsck")},
                     {('m'), QLatin1String("mount")},
                     {('m'), QLatin1String("mkdir")},
                     {('m'), QLatin1String("mkswap")},
                     {('s'), QLatin1String("sleep")},
                     {('l'), QLatin1String("ls")},
                     {('w'), QLatin1String("wget")},
                     {('k'), QLatin1String("kill")},
                     {('k'), QLatin1String("killall")},
                     {('g'), QLatin1String("gdb")},
                     {('Q'), QLatin1String("QOwnNotes")},
                     {('q'), QLatin1String("qownnotes")},
                     {('d'), QLatin1String("docker")},
                     {('o'), QLatin1String("openssl")},
                     {('p'), QLatin1String("php")},
                     {('p'), QLatin1String("python")},
                     {('p'), QLatin1String("perl")},
                     {('g'), QLatin1String("go")},
                     {('c'), QLatin1String("curl")}};

    shell_other = {};
}